

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O2

void makeContextCurrentGLX(_GLFWwindow *window)

{
  int iVar1;
  char *format;
  
  if (window == (_GLFWwindow *)0x0) {
    iVar1 = (*_glfw.glx.MakeCurrent)(_glfw.x11.display,0,(GLXContext)0x0);
    if (iVar1 != 0) goto LAB_0011ac9a;
    format = "GLX: Failed to clear current context";
  }
  else {
    iVar1 = (*_glfw.glx.MakeCurrent)
                      (_glfw.x11.display,(window->context).glx.window,(window->context).glx.handle);
    if (iVar1 != 0) {
LAB_0011ac9a:
      _glfwPlatformSetTls(&_glfw.contextSlot,window);
      return;
    }
    format = "GLX: Failed to make context current";
  }
  _glfwInputError(0x10008,format);
  return;
}

Assistant:

static void makeContextCurrentGLX(_GLFWwindow* window)
{
    if (window)
    {
        if (!glXMakeCurrent(_glfw.x11.display,
                            window->context.glx.window,
                            window->context.glx.handle))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "GLX: Failed to make context current");
            return;
        }
    }
    else
    {
        if (!glXMakeCurrent(_glfw.x11.display, None, NULL))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "GLX: Failed to clear current context");
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}